

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_parser.hpp
# Opt level: O1

size_t __thiscall
jsoncons::msgpack::basic_msgpack_parser<jsoncons::bytes_source,_std::allocator<char>_>::get_size
          (basic_msgpack_parser<jsoncons::bytes_source,_std::allocator<char>_> *this,uint8_t type,
          error_code *ec)

{
  value_type *pvVar1;
  value_type *pvVar2;
  size_t sVar3;
  msgpack_errc __e;
  undefined7 in_register_00000031;
  size_t sVar4;
  ulong uVar5;
  uint8_t buf_2 [1];
  uint8_t buf [2];
  uint8_t buf_1 [4];
  byte local_2f;
  ushort local_2e;
  uint local_2c;
  
  switch((int)CONCAT71(in_register_00000031,type)) {
  case 0xc4:
  case 199:
  case 0xd9:
    pvVar1 = (this->source_).current_;
    pvVar2 = (this->source_).end_;
    uVar5 = (ulong)(pvVar2 != pvVar1);
    memcpy(&local_2f,pvVar1,uVar5);
    (this->source_).current_ = pvVar1 + uVar5;
    if (pvVar2 != pvVar1) {
      return (ulong)local_2f;
    }
    goto LAB_0052e640;
  case 0xc5:
  case 200:
  case 0xda:
  case 0xdc:
  case 0xde:
    pvVar1 = (this->source_).current_;
    uVar5 = (long)(this->source_).end_ - (long)pvVar1;
    sVar4 = 2;
    if (uVar5 < 2) {
      sVar4 = uVar5;
    }
    memcpy(&local_2e,pvVar1,sVar4);
    (this->source_).current_ = pvVar1 + sVar4;
    if (1 < uVar5) {
      return (ulong)(ushort)(local_2e << 8 | local_2e >> 8);
    }
    goto LAB_0052e640;
  case 0xc6:
  case 0xc9:
  case 0xdb:
  case 0xdd:
  case 0xdf:
    pvVar1 = (this->source_).current_;
    uVar5 = (long)(this->source_).end_ - (long)pvVar1;
    sVar4 = 4;
    if (uVar5 < 4) {
      sVar4 = uVar5;
    }
    memcpy(&local_2c,pvVar1,sVar4);
    (this->source_).current_ = pvVar1 + sVar4;
    if (3 < uVar5) {
      return (ulong)(local_2c >> 0x18 | (local_2c & 0xff0000) >> 8 | (local_2c & 0xff00) << 8 |
                    local_2c << 0x18);
    }
LAB_0052e640:
    __e = unexpected_eof;
LAB_0052e648:
    std::error_code::operator=(ec,__e);
    this->more_ = false;
    sVar3 = 0;
    break;
  default:
    if ((char)type < -0x70 || (type & 0xf0) == 0x90) {
      return (ulong)(type & 0xf);
    }
    __e = unknown_type;
    goto LAB_0052e648;
  case 0xd4:
    sVar3 = 1;
    break;
  case 0xd5:
    sVar3 = 2;
    break;
  case 0xd6:
    sVar3 = 4;
    break;
  case 0xd7:
    sVar3 = 8;
    break;
  case 0xd8:
    sVar3 = 0x10;
  }
  return sVar3;
}

Assistant:

std::size_t get_size(uint8_t type, std::error_code& ec)
    {
        switch (type)
        {
            case jsoncons::msgpack::msgpack_type::str8_type: 
            case jsoncons::msgpack::msgpack_type::bin8_type: 
            case jsoncons::msgpack::msgpack_type::ext8_type: 
            {
                uint8_t buf[sizeof(int8_t)];
                if (source_.read(buf, sizeof(int8_t)) != sizeof(int8_t))
                {
                    ec = msgpack_errc::unexpected_eof;
                    more_ = false;
                    return 0;
                }
                uint8_t len = binary::big_to_native<uint8_t>(buf, sizeof(buf));
                return static_cast<std::size_t>(len);
            }

            case jsoncons::msgpack::msgpack_type::str16_type: 
            case jsoncons::msgpack::msgpack_type::bin16_type: 
            case jsoncons::msgpack::msgpack_type::ext16_type: 
            case jsoncons::msgpack::msgpack_type::array16_type: 
            case jsoncons::msgpack::msgpack_type::map16_type:
            {
                uint8_t buf[sizeof(int16_t)];
                if (source_.read(buf, sizeof(int16_t)) != sizeof(int16_t))
                {
                    ec = msgpack_errc::unexpected_eof;
                    more_ = false;
                    return 0;
                }
                uint16_t len = binary::big_to_native<uint16_t>(buf, sizeof(buf));
                return static_cast<std::size_t>(len);
            }

            case jsoncons::msgpack::msgpack_type::str32_type: 
            case jsoncons::msgpack::msgpack_type::bin32_type: 
            case jsoncons::msgpack::msgpack_type::ext32_type: 
            case jsoncons::msgpack::msgpack_type::array32_type: 
            case jsoncons::msgpack::msgpack_type::map32_type : 
            {
                uint8_t buf[sizeof(int32_t)];
                if (source_.read(buf, sizeof(int32_t)) != sizeof(int32_t))
                {
                    ec = msgpack_errc::unexpected_eof;
                    more_ = false;
                    return 0;
                }
                uint32_t len = binary::big_to_native<uint32_t>(buf, sizeof(buf));
                return static_cast<std::size_t>(len);
            }
            case jsoncons::msgpack::msgpack_type::fixext1_type: 
                return 1;
            case jsoncons::msgpack::msgpack_type::fixext2_type: 
                return 2;
            case jsoncons::msgpack::msgpack_type::fixext4_type: 
                return 4;
            case jsoncons::msgpack::msgpack_type::fixext8_type: 
                return 8;
            case jsoncons::msgpack::msgpack_type::fixext16_type: 
                return 16;
            default:
                if ((type > 0x8f && type <= 0x9f) // fixarray
                    || (type > 0x7f && type <= 0x8f) // fixmap
        )
                {
                    return type & 0x0f;
                }
                else
                {
                    ec = msgpack_errc::unknown_type;
                    more_ = false;
                    return 0;
                }
                break;
        }
    }